

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmJmp<(moira::Instr)65,(moira::Mode)8,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  Ea<(moira::Mode)8,_(moira::Size)4> src;
  Ea<(moira::Mode)8,_(moira::Size)4> local_34;
  
  local_34.reg = op & 7;
  local_34.pc = *addr;
  *addr = local_34.pc + 2;
  iVar3 = (*this->_vptr_Moira[5])();
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[5])(this);
  local_34.ext1 = uVar4 & 0xffff | iVar3 << 0x10;
  pcVar5 = "jmp";
  if (str->upper != false) {
    pcVar5 = "JMP";
  }
  cVar1 = *pcVar5;
  while (cVar1 != '\0') {
    pcVar5 = pcVar5 + 1;
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar1;
    cVar1 = *pcVar5;
  }
  iVar3 = (this->tab).raw;
  while (pcVar5 = str->ptr, pcVar5 < str->base + iVar3) {
    str->ptr = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  StrWriter::operator<<(str,&local_34);
  return;
}

Assistant:

void
Moira::dasmJmp(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << tab << src;
}